

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O1

Output_GetCameraWindowSize * __thiscall
ViconDataStreamSDK::CPP::Client::GetCameraWindowSize
          (Output_GetCameraWindowSize *__return_storage_ptr__,Client *this,string *i_rCameraName)

{
  Enum EVar1;
  
  EVar1 = Core::VClient::GetCameraWindowSize
                    ((this->m_pClientImpl->m_pCoreClient).
                     super___shared_ptr<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,i_rCameraName,&__return_storage_ptr__->WindowStartX,
                     &__return_storage_ptr__->WindowStartY,&__return_storage_ptr__->WindowWidth,
                     &__return_storage_ptr__->WindowHeight);
  if ((EVar1 < (ConfigurationFailed|Success)) &&
     ((0x3fefffffU >> (EVar1 & (ConfigurationFailed|InvalidHostName)) & 1) != 0)) {
    __return_storage_ptr__->Result = *(Enum *)(&DAT_001723b0 + (ulong)EVar1 * 4);
    return __return_storage_ptr__;
  }
  __assert_fail("!\"Unexpected result code returned\"",
                "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDK_CPP/CoreAdapters.h"
                ,0x82,
                "ViconDataStreamSDK::CPP::Result::Enum Adapt(ViconDataStreamSDK::Core::Result::Enum)"
               );
}

Assistant:

CLASS_DECLSPEC
  Output_GetCameraWindowSize Client::GetCameraWindowSize( const std::string & i_rCameraName ) const
  {
    Output_GetCameraWindowSize Output;
    Output.Result = Adapt(m_pClientImpl->m_pCoreClient->GetCameraWindowSize(
      i_rCameraName,
      Output.WindowStartX,
      Output.WindowStartY,
      Output.WindowWidth,
      Output.WindowHeight ));

    return Output;
  }